

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O3

int stbi__tga_test(stbi__context *s)

{
  byte bVar1;
  byte bVar2;
  stbi_uc sVar3;
  stbi_uc sVar4;
  stbi_uc *psVar5;
  int iVar6;
  uint uVar7;
  int iVar9;
  void *pvVar10;
  uint uVar8;
  
  stbi__get8(s);
  bVar1 = stbi__get8(s);
  uVar7 = 0;
  uVar8 = 0;
  if (1 < bVar1) goto LAB_00134a99;
  bVar2 = stbi__get8(s);
  if (bVar1 == 1) {
    if ((bVar2 & 0xf7) != 1) goto LAB_00134a99;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar5 = s->img_buffer;
LAB_00134b45:
      s->img_buffer = psVar5 + 4;
    }
    else {
      psVar5 = s->img_buffer;
      iVar6 = (int)s->img_buffer_end - (int)psVar5;
      if (3 < iVar6) goto LAB_00134b45;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,4 - iVar6);
    }
    bVar2 = stbi__get8(s);
    if ((0x20 < bVar2) || (uVar7 = uVar8, (0x101018100U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
    goto LAB_00134a99;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar5 = s->img_buffer;
    }
    else {
      psVar5 = s->img_buffer;
      iVar6 = (int)s->img_buffer_end - (int)psVar5;
      if (iVar6 < 4) {
        s->img_buffer = s->img_buffer_end;
        pvVar10 = s->io_user_data;
        iVar9 = 4;
        goto LAB_00134ba5;
      }
    }
    psVar5 = psVar5 + 4;
LAB_00134bc4:
    s->img_buffer = psVar5;
  }
  else {
    uVar7 = uVar8;
    if ((bVar2 & 0xf6) != 2) goto LAB_00134a99;
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
      psVar5 = s->img_buffer;
LAB_00134bb3:
      psVar5 = psVar5 + 9;
      goto LAB_00134bc4;
    }
    psVar5 = s->img_buffer;
    iVar6 = (int)s->img_buffer_end - (int)psVar5;
    if (8 < iVar6) goto LAB_00134bb3;
    s->img_buffer = s->img_buffer_end;
    pvVar10 = s->io_user_data;
    iVar9 = 9;
LAB_00134ba5:
    (*(s->io).skip)(pvVar10,iVar9 - iVar6);
  }
  sVar3 = stbi__get8(s);
  sVar4 = stbi__get8(s);
  uVar7 = uVar8;
  if (CONCAT11(sVar4,sVar3) != 0) {
    sVar3 = stbi__get8(s);
    sVar4 = stbi__get8(s);
    if (CONCAT11(sVar4,sVar3) != 0) {
      bVar2 = stbi__get8(s);
      if (bVar1 == 1) {
        uVar7 = (uint)((bVar2 - 8 & 0xf7) == 0);
      }
      else if ((bVar2 < 0x21) && ((0x101018100U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
        uVar7 = 1;
      }
    }
  }
LAB_00134a99:
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  return uVar7;
}

Assistant:

static int stbi__tga_test(stbi__context *s)
{
   int res = 0;
   int sz, tga_color_type;
   stbi__get8(s);      //   discard Offset
   tga_color_type = stbi__get8(s);   //   color type
   if ( tga_color_type > 1 ) goto errorEnd;   //   only RGB or indexed allowed
   sz = stbi__get8(s);   //   image type
   if ( tga_color_type == 1 ) { // colormapped (paletted) image
      if (sz != 1 && sz != 9) goto errorEnd; // colortype 1 demands image type 1 or 9
      stbi__skip(s,4);       // skip index of first colormap entry and number of entries
      sz = stbi__get8(s);    //   check bits per palette color entry
      if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;
      stbi__skip(s,4);       // skip image x and y origin
   } else { // "normal" image w/o colormap
      if ( (sz != 2) && (sz != 3) && (sz != 10) && (sz != 11) ) goto errorEnd; // only RGB or grey allowed, +/- RLE
      stbi__skip(s,9); // skip colormap specification and image x/y origin
   }
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test width
   if ( stbi__get16le(s) < 1 ) goto errorEnd;      //   test height
   sz = stbi__get8(s);   //   bits per pixel
   if ( (tga_color_type == 1) && (sz != 8) && (sz != 16) ) goto errorEnd; // for colormapped images, bpp is size of an index
   if ( (sz != 8) && (sz != 15) && (sz != 16) && (sz != 24) && (sz != 32) ) goto errorEnd;

   res = 1; // if we got this far, everything's good and we can return 1 instead of 0

errorEnd:
   stbi__rewind(s);
   return res;
}